

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

int32_t unistrTextReplace(UText *ut,int64_t start,int64_t limit,UChar *src,int32_t length,
                         UErrorCode *pErrorCode)

{
  short sVar1;
  ushort uVar2;
  UnicodeString *this;
  int32_t iVar3;
  int32_t offset;
  int iVar4;
  long lVar5;
  int32_t iVar6;
  int64_t iVar7;
  char16_t *pcVar8;
  
  iVar4 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (UnicodeString *)ut->context;
    if (length != 0 && src == (UChar *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (limit < start) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      iVar4 = 0;
    }
    else {
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      lVar5 = (long)iVar6;
      iVar7 = start;
      if (lVar5 < start) {
        iVar7 = lVar5;
      }
      iVar3 = (int32_t)iVar7;
      if (start < 0) {
        iVar3 = 0;
      }
      iVar7 = limit;
      if (lVar5 < limit) {
        iVar7 = lVar5;
      }
      offset = (int32_t)iVar7;
      if (limit < 0) {
        offset = 0;
      }
      if (iVar3 < iVar6) {
        iVar3 = icu_63::UnicodeString::getChar32Start(this,iVar3);
      }
      if (offset < iVar6) {
        offset = icu_63::UnicodeString::getChar32Start(this,offset);
      }
      icu_63::UnicodeString::doReplace(this,iVar3,offset - iVar3,src,0,length);
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
      if ((short)uVar2 < 0) {
        iVar3 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)(short)uVar2 >> 5;
      }
      if (((int)(short)uVar2 & 0x11U) == 0) {
        if ((uVar2 & 2) == 0) {
          pcVar8 = (this->fUnion).fFields.fArray;
        }
        else {
          pcVar8 = (char16_t *)((long)&this->fUnion + 2);
        }
      }
      else {
        pcVar8 = (char16_t *)0x0;
      }
      ut->chunkContents = pcVar8;
      ut->chunkLength = iVar3;
      ut->chunkNativeLimit = (long)iVar3;
      ut->nativeIndexingLimit = iVar3;
      iVar4 = iVar3 - iVar6;
      ut->chunkOffset = offset + iVar4;
    }
  }
  return iVar4;
}

Assistant:

static int32_t U_CALLCONV
unistrTextReplace(UText *ut,
                  int64_t start, int64_t limit,
                  const UChar *src, int32_t length,
                  UErrorCode *pErrorCode) {
    UnicodeString *us=(UnicodeString *)ut->context;
    int32_t oldLength;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(src==NULL && length!=0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    }
    if(start>limit) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    oldLength=us->length();
    int32_t start32 = pinIndex(start, oldLength);
    int32_t limit32 = pinIndex(limit, oldLength);
    if (start32 < oldLength) {
        start32 = us->getChar32Start(start32);
    }
    if (limit32 < oldLength) {
        limit32 = us->getChar32Start(limit32);
    }

    // replace
    us->replace(start32, limit32-start32, src, length);
    int32_t newLength = us->length();

    // Update the chunk description.
    ut->chunkContents    = us->getBuffer();
    ut->chunkLength      = newLength;
    ut->chunkNativeLimit = newLength;
    ut->nativeIndexingLimit = newLength;

    // Set iteration position to the point just following the newly inserted text.
    int32_t lengthDelta = newLength - oldLength;
    ut->chunkOffset = limit32 + lengthDelta;

    return lengthDelta;
}